

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-test.c++
# Opt level: O1

Own<void,_std::nullptr_t> __thiscall
capnp::_::anon_unknown_0::TestVat::ConnectionImpl::awaitThirdParty
          (ConnectionImpl *this,Reader party,Rc<kj::Refcounted> *value)

{
  ThirdPartyExchange *pTVar1;
  _func_int **pp_Var2;
  void *extraout_RDX;
  _func_int *token;
  Own<void,_std::nullptr_t> OVar3;
  Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_rpc_test_c__:529:33)>
  local_38;
  
  if (party._reader.dataSize < 0x40) {
    token = (_func_int *)0x0;
  }
  else {
    token = *party._reader.data;
  }
  pTVar1 = getTphExchange((TestVat *)value[2].own.disposer,(uint64_t)token);
  (*(((pTVar1->fulfiller).ptr)->super_PromiseRejector)._vptr_PromiseRejector[2])();
  local_38.maybeFunc.ptr.isSet = true;
  local_38.maybeFunc.ptr.field_1.value.this = (ConnectionImpl *)value;
  local_38.maybeFunc.ptr.field_1.value.token = (uint64_t)token;
  pp_Var2 = (_func_int **)operator_new(0x18);
  *(undefined1 *)pp_Var2 = 1;
  pp_Var2[1] = (_func_int *)local_38.maybeFunc.ptr.field_1.value.this;
  pp_Var2[2] = (_func_int *)local_38.maybeFunc.ptr.field_1.value.token;
  local_38.maybeFunc.ptr.isSet = false;
  (this->super_Connection).super_Connection._vptr_Connection =
       (_func_int **)
       &kj::_::
        HeapDisposer<kj::_::Deferred<capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl::awaitThirdParty(capnproto_test::capnp::test::TestThirdPartyToAwait::Reader,kj::Rc<kj::Refcounted>)::{lambda()#1}>>
        ::instance;
  (this->super_Refcounted).super_Disposer._vptr_Disposer = pp_Var2;
  kj::_::
  Deferred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-test.c++:529:33)>
  ::~Deferred(&local_38);
  OVar3.ptr = extraout_RDX;
  OVar3.disposer = (Disposer *)this;
  return OVar3;
}

Assistant:

kj::Own<void> awaitThirdParty(
        test::TestThirdPartyToAwait::Reader party,
        kj::Rc<kj::Refcounted> value) override {
      uint64_t token = party.getToken();
      auto& xchg = vat.getTphExchange(token);
      xchg.fulfiller->fulfill(kj::mv(value));

      return kj::heap(kj::defer([this, token]() {
        vat.tphExchanges.erase(token);
      }));
    }